

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elements.c
# Opt level: O0

int wally_asset_pak_whitelistproof
              (uchar *online_keys,size_t online_keys_len,uchar *offline_keys,size_t offline_keys_len
              ,size_t key_index,uchar *sub_pubkey,size_t sub_pubkey_len,uchar *online_priv_key,
              size_t online_priv_key_len,uchar *summed_key,size_t summed_key_len,uchar *bytes_out,
              size_t len,size_t *written)

{
  int iVar1;
  secp256k1_context *ctx_00;
  int local_a0dc;
  ulong uStack_a0d8;
  int ret;
  size_t i;
  size_t sig_size;
  size_t num_keys;
  secp256k1_whitelist_signature sig;
  secp256k1_pubkey pubkey;
  secp256k1_pubkey offline_secp_keys [256];
  secp256k1_pubkey online_secp_keys [256];
  secp256k1_context *ctx;
  uchar *sub_pubkey_local;
  size_t key_index_local;
  size_t offline_keys_len_local;
  uchar *offline_keys_local;
  size_t online_keys_len_local;
  uchar *online_keys_local;
  
  ctx_00 = secp_ctx();
  sig_size = offline_keys_len / 0x21;
  i = (sig_size + 1) * 0x20 + 1;
  if (written != (size_t *)0x0) {
    *written = 0;
  }
  if (ctx_00 == (secp256k1_context *)0x0) {
    online_keys_local._4_4_ = -3;
  }
  else if ((((((online_keys == (uchar *)0x0) || (online_keys_len != offline_keys_len)) ||
             (offline_keys == (uchar *)0x0)) ||
            (((offline_keys_len == 0 || (offline_keys_len % 0x21 != 0)) ||
             ((sig_size <= key_index || ((0x100 < sig_size || (sub_pubkey == (uchar *)0x0)))))))) ||
           (sub_pubkey_len != 0x21)) ||
          ((((online_priv_key == (uchar *)0x0 || (online_priv_key_len != 0x20)) ||
            (summed_key == (uchar *)0x0)) ||
           (((summed_key_len != 0x20 ||
             (iVar1 = pubkey_parse((secp256k1_pubkey *)(sig.data + 0x2018),sub_pubkey,0x21),
             iVar1 == 0)) ||
            ((bytes_out == (uchar *)0x0 || ((len == 0 || (written == (size_t *)0x0)))))))))) {
    online_keys_local._4_4_ = -2;
  }
  else if (len < i) {
    *written = i;
    online_keys_local._4_4_ = 0;
  }
  else {
    for (uStack_a0d8 = 0; uStack_a0d8 < sig_size; uStack_a0d8 = uStack_a0d8 + 1) {
      iVar1 = pubkey_parse((secp256k1_pubkey *)(offline_secp_keys[uStack_a0d8 + 0xff].data + 0x38),
                           online_keys + uStack_a0d8 * 0x21,0x21);
      if ((iVar1 == 0) ||
         (iVar1 = pubkey_parse((secp256k1_pubkey *)(offline_secp_keys[uStack_a0d8 - 1].data + 0x38),
                               offline_keys + uStack_a0d8 * 0x21,0x21), iVar1 == 0)) {
        local_a0dc = -2;
        goto LAB_00171eac;
      }
    }
    iVar1 = secp256k1_whitelist_sign
                      (ctx_00,(secp256k1_whitelist_signature *)&num_keys,
                       (secp256k1_pubkey *)(offline_secp_keys[0xff].data + 0x38),
                       (secp256k1_pubkey *)(pubkey.data + 0x38),sig_size,
                       (secp256k1_pubkey *)(sig.data + 0x2018),online_priv_key,summed_key,key_index,
                       (secp256k1_nonce_function)0x0,(void *)0x0);
    if (((iVar1 == 0) ||
        (iVar1 = secp256k1_whitelist_verify
                           (ctx_00,(secp256k1_whitelist_signature *)&num_keys,
                            (secp256k1_pubkey *)(offline_secp_keys[0xff].data + 0x38),
                            (secp256k1_pubkey *)(pubkey.data + 0x38),sig_size,
                            (secp256k1_pubkey *)(sig.data + 0x2018)), iVar1 == 0)) ||
       (iVar1 = secp256k1_whitelist_signature_serialize
                          (ctx_00,bytes_out,&i,(secp256k1_whitelist_signature *)&num_keys),
       iVar1 == 0)) {
      local_a0dc = -1;
    }
    else {
      local_a0dc = 0;
      *written = i;
    }
LAB_00171eac:
    wally_clear_3(offline_secp_keys[0xff].data + 0x38,0x4000,pubkey.data + 0x38,0x4000,
                  sig.data + 0x2018,0x40);
    online_keys_local._4_4_ = local_a0dc;
  }
  return online_keys_local._4_4_;
}

Assistant:

int wally_asset_pak_whitelistproof(
    const unsigned char *online_keys,
    size_t online_keys_len,
    const unsigned char *offline_keys,
    size_t offline_keys_len,
    size_t key_index,
    const unsigned char *sub_pubkey,
    size_t sub_pubkey_len,
    const unsigned char *online_priv_key,
    size_t online_priv_key_len,
    const unsigned char *summed_key,
    size_t summed_key_len,
    unsigned char *bytes_out,
    size_t len,
    size_t *written)
{
    const secp256k1_context *ctx = secp_ctx();
    secp256k1_pubkey online_secp_keys[SECP256K1_WHITELIST_MAX_N_KEYS];
    secp256k1_pubkey offline_secp_keys[SECP256K1_WHITELIST_MAX_N_KEYS];
    secp256k1_pubkey pubkey;
    secp256k1_whitelist_signature sig;
    const size_t num_keys = offline_keys_len / EC_PUBLIC_KEY_LEN;
    size_t sig_size = (1 + 32 * (1 + num_keys));
    size_t i;
    int ret;

    if (written)
        *written = 0;

    if (!ctx)
        return WALLY_ENOMEM;

    if (!online_keys || online_keys_len != offline_keys_len ||
        !offline_keys || !offline_keys_len ||
        offline_keys_len % EC_PUBLIC_KEY_LEN || key_index >= num_keys ||
        num_keys > SECP256K1_WHITELIST_MAX_N_KEYS ||
        !sub_pubkey || sub_pubkey_len != EC_PUBLIC_KEY_LEN ||
        !online_priv_key || online_priv_key_len != EC_PRIVATE_KEY_LEN ||
        !summed_key || summed_key_len != EC_PRIVATE_KEY_LEN ||
        !pubkey_parse(&pubkey, sub_pubkey, sub_pubkey_len) ||
        !bytes_out || !len || !written)
        return WALLY_EINVAL;

    if (len < sig_size) {
        *written = sig_size;
        return WALLY_OK; /* Tell the caller the required size */
    }

    for (i = 0; i < num_keys; ++i) {
        if (!pubkey_parse(&online_secp_keys[i], online_keys + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN) ||
            !pubkey_parse(&offline_secp_keys[i], offline_keys + i * EC_PUBLIC_KEY_LEN, EC_PUBLIC_KEY_LEN)) {
            ret = WALLY_EINVAL;
            goto fail;
        }
    }

    if (secp256k1_whitelist_sign(ctx, &sig, online_secp_keys, offline_secp_keys, num_keys,
                                 &pubkey, online_priv_key, summed_key, key_index, NULL, NULL) &&
        secp256k1_whitelist_verify(ctx, &sig, online_secp_keys, offline_secp_keys, num_keys, &pubkey) &&
        secp256k1_whitelist_signature_serialize(ctx, bytes_out, &sig_size, &sig)) {
        ret = WALLY_OK;
        *written = sig_size;
    } else
        ret = WALLY_ERROR;

fail:
    wally_clear_3(online_secp_keys, sizeof(online_secp_keys),
                  offline_secp_keys, (sizeof(offline_secp_keys)),
                  &pubkey, sizeof(pubkey));
    return ret;
}